

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::FillMaterials(ColladaLoader *this,ColladaParser *pParser,aiScene *param_2)

{
  bool bVar1;
  Logger *this_00;
  ulong uVar2;
  uint local_54;
  Effect *pEStack_50;
  int shadeMode;
  Effect *effect;
  aiMaterial *mat;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> *elem;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  *__range1;
  aiScene *param_2_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  __end1 = std::
           vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
           ::begin(&this->newMats);
  elem = (pair<Assimp::Collada::Effect_*,_aiMaterial_*> *)
         std::
         vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
         ::end(&this->newMats);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_*,_std::vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>_>
                                     *)&elem), bVar1) {
    mat = (aiMaterial *)
          __gnu_cxx::
          __normal_iterator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_*,_std::vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>_>
          ::operator*(&__end1);
    effect = *(Effect **)&mat->mNumProperties;
    pEStack_50 = (Effect *)mat->mProperties;
    if ((pEStack_50->mFaceted & 1U) == 0) {
      switch(pEStack_50->mShadeType) {
      case Shade_Constant:
        local_54 = 9;
        break;
      case Shade_Lambert:
        local_54 = 2;
        break;
      case Shade_Phong:
        local_54 = 3;
        break;
      case Shade_Blinn:
        local_54 = 4;
        break;
      default:
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Collada: Unrecognized shading mode, using gouraud shading");
        local_54 = 2;
      }
    }
    else {
      local_54 = 1;
    }
    aiMaterial::AddProperty<int>((aiMaterial *)effect,(int *)&local_54,1,"$mat.shadingm",0,0);
    local_54 = (uint)(pEStack_50->mDoubleSided & 1);
    aiMaterial::AddProperty<int>((aiMaterial *)effect,(int *)&local_54,1,"$mat.twosided",0,0);
    local_54 = (uint)(pEStack_50->mWireframe & 1);
    aiMaterial::AddProperty<int>((aiMaterial *)effect,(int *)&local_54,1,"$mat.wireframe",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mAmbient,1,"$clr.ambient",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mDiffuse,1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mSpecular,1,"$clr.specular",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mEmissive,1,"$clr.emissive",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mReflective,1,"$clr.reflective",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mShininess,1,"$mat.shininess",0,0);
    aiMaterial::AddProperty
              ((aiMaterial *)effect,&pEStack_50->mReflectivity,1,"$mat.reflectivity",0,0);
    aiMaterial::AddProperty((aiMaterial *)effect,&pEStack_50->mRefractIndex,1,"$mat.refracti",0,0);
    if ((0.0 <= pEStack_50->mTransparency) && (pEStack_50->mTransparency <= 1.0)) {
      if ((pEStack_50->mRGBTransparency & 1U) == 0) {
        pEStack_50->mTransparency = (pEStack_50->mTransparent).a * pEStack_50->mTransparency;
      }
      else {
        pEStack_50->mTransparency =
             ((pEStack_50->mTransparent).b * 0.072169 +
             (pEStack_50->mTransparent).r * 0.212671 + (pEStack_50->mTransparent).g * 0.71516) *
             pEStack_50->mTransparency;
        (pEStack_50->mTransparent).a = 1.0;
        aiMaterial::AddProperty
                  ((aiMaterial *)effect,&pEStack_50->mTransparent,1,"$clr.transparent",0,0);
      }
      if ((pEStack_50->mInvertTransparency & 1U) != 0) {
        pEStack_50->mTransparency = 1.0 - pEStack_50->mTransparency;
      }
      if (((pEStack_50->mHasTransparency & 1U) != 0) ||
         (pEStack_50->mTransparency <= 1.0 && pEStack_50->mTransparency != 1.0)) {
        aiMaterial::AddProperty
                  ((aiMaterial *)effect,&pEStack_50->mTransparency,1,"$mat.opacity",0,0);
      }
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexAmbient,
                 aiTextureType_LIGHTMAP,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexEmissive,
                 aiTextureType_EMISSIVE,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexSpecular,
                 aiTextureType_SPECULAR,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexDiffuse,
                 aiTextureType_DIFFUSE,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexBump,
                 aiTextureType_NORMALS,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexTransparent,
                 aiTextureType_OPACITY,0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      AddTexture(this,(aiMaterial *)effect,pParser,pEStack_50,&pEStack_50->mTexReflective,
                 aiTextureType_REFLECTION,0);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_*,_std::vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ColladaLoader::FillMaterials(const ColladaParser& pParser, aiScene* /*pScene*/)
{
    for (auto &elem : newMats)
    {
        aiMaterial&  mat = (aiMaterial&)*elem.second;
        Collada::Effect& effect = *elem.first;

        // resolve shading mode
        int shadeMode;
        if (effect.mFaceted) /* fixme */
            shadeMode = aiShadingMode_Flat;
        else {
            switch (effect.mShadeType)
            {
            case Collada::Shade_Constant:
                shadeMode = aiShadingMode_NoShading;
                break;
            case Collada::Shade_Lambert:
                shadeMode = aiShadingMode_Gouraud;
                break;
            case Collada::Shade_Blinn:
                shadeMode = aiShadingMode_Blinn;
                break;
            case Collada::Shade_Phong:
                shadeMode = aiShadingMode_Phong;
                break;

            default:
                ASSIMP_LOG_WARN("Collada: Unrecognized shading mode, using gouraud shading");
                shadeMode = aiShadingMode_Gouraud;
                break;
            }
        }
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_SHADING_MODEL);

        // double-sided?
        shadeMode = effect.mDoubleSided;
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_TWOSIDED);

        // wireframe?
        shadeMode = effect.mWireframe;
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_ENABLE_WIREFRAME);

        // add material colors
        mat.AddProperty(&effect.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
        mat.AddProperty(&effect.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat.AddProperty(&effect.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        mat.AddProperty(&effect.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);
        mat.AddProperty(&effect.mReflective, 1, AI_MATKEY_COLOR_REFLECTIVE);

        // scalar properties
        mat.AddProperty(&effect.mShininess, 1, AI_MATKEY_SHININESS);
        mat.AddProperty(&effect.mReflectivity, 1, AI_MATKEY_REFLECTIVITY);
        mat.AddProperty(&effect.mRefractIndex, 1, AI_MATKEY_REFRACTI);

        // transparency, a very hard one. seemingly not all files are following the
        // specification here (1.0 transparency => completely opaque)...
        // therefore, we let the opportunity for the user to manually invert
        // the transparency if necessary and we add preliminary support for RGB_ZERO mode
        if (effect.mTransparency >= 0.f && effect.mTransparency <= 1.f) {
            // handle RGB transparency completely, cf Collada specs 1.5.0 pages 249 and 304
            if (effect.mRGBTransparency) {
                // use luminance as defined by ISO/CIE color standards (see ITU-R Recommendation BT.709-4)
                effect.mTransparency *= (
                    0.212671f * effect.mTransparent.r +
                    0.715160f * effect.mTransparent.g +
                    0.072169f * effect.mTransparent.b
                    );

                effect.mTransparent.a = 1.f;

                mat.AddProperty(&effect.mTransparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
            }
            else {
                effect.mTransparency *= effect.mTransparent.a;
            }

            if (effect.mInvertTransparency) {
                effect.mTransparency = 1.f - effect.mTransparency;
            }

            // Is the material finally transparent ?
            if (effect.mHasTransparency || effect.mTransparency < 1.f) {
                mat.AddProperty(&effect.mTransparency, 1, AI_MATKEY_OPACITY);
            }
        }

        // add textures, if given
        if (!effect.mTexAmbient.mName.empty()) {
            // It is merely a light-map
            AddTexture(mat, pParser, effect, effect.mTexAmbient, aiTextureType_LIGHTMAP);
        }

        if (!effect.mTexEmissive.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexEmissive, aiTextureType_EMISSIVE);

        if (!effect.mTexSpecular.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexSpecular, aiTextureType_SPECULAR);

        if (!effect.mTexDiffuse.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexDiffuse, aiTextureType_DIFFUSE);

        if (!effect.mTexBump.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexBump, aiTextureType_NORMALS);

        if (!effect.mTexTransparent.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexTransparent, aiTextureType_OPACITY);

        if (!effect.mTexReflective.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexReflective, aiTextureType_REFLECTION);
    }
}